

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

void __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst,
          bool merge,FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  TArray<Rect,_Rect> *this_00;
  int height;
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  Rect *pRVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint local_80;
  uint local_7c;
  Rect local_58;
  DisjointRectCollection *local_40;
  TArray<Rect,_Rect> *local_38;
  
  TArray<Rect,_Rect>::Clear(dst);
  this_00 = &this->freeRectangles;
  local_38 = &this->usedRectangles;
  local_40 = &this->disjointRects;
  bVar6 = false;
  local_80 = 0;
  local_7c = 0;
  do {
    uVar7 = *(uint *)(rects + 0xc);
    if (uVar7 == 0) {
      return;
    }
    iVar11 = 0x7fffffff;
    for (uVar5 = 0; uVar5 < (this->freeRectangles).Count; uVar5 = uVar5 + 1) {
      for (uVar10 = 0; uVar10 < uVar7; uVar10 = uVar10 + 1) {
        iVar3 = *(int *)(*(long *)rects + uVar10 * 8);
        height = *(int *)(*(long *)rects + 4 + uVar10 * 8);
        iVar1 = this_00->Array[uVar5].width;
        pRVar8 = this_00->Array + uVar5;
        uVar9 = (uint)uVar10;
        if ((iVar3 == iVar1) && (height == pRVar8->height)) {
          uVar4 = (this->freeRectangles).Count;
          bVar6 = false;
LAB_0034a985:
          iVar11 = -0x80000000;
          local_7c = uVar5;
          uVar5 = uVar4;
          local_80 = uVar9;
          break;
        }
        if ((height == iVar1) && (iVar3 == pRVar8->height)) {
          uVar4 = (this->freeRectangles).Count;
          bVar6 = true;
          goto LAB_0034a985;
        }
        if ((iVar1 < iVar3) || (pRVar8->height < height)) {
          if ((height <= iVar1) &&
             ((iVar3 <= pRVar8->height &&
              (iVar3 = ScoreByHeuristic(height,iVar3,pRVar8,rectChoice), iVar3 < iVar11)))) {
            bVar6 = true;
            iVar11 = iVar3;
            local_80 = uVar9;
            local_7c = uVar5;
          }
        }
        else {
          iVar3 = ScoreByHeuristic(iVar3,height,pRVar8,rectChoice);
          if (iVar3 < iVar11) {
            bVar6 = false;
            iVar11 = iVar3;
            local_80 = uVar9;
            local_7c = uVar5;
          }
        }
        uVar7 = *(uint *)(rects + 0xc);
      }
    }
    if (iVar11 == 0x7fffffff) {
      return;
    }
    pRVar8 = this_00->Array + (int)local_7c;
    local_58.x = pRVar8->x;
    local_58.y = pRVar8->y;
    local_58._8_8_ = *(undefined8 *)(*(long *)rects + (long)(int)local_80 * 8);
    if (bVar6) {
      iVar11 = local_58.height;
      local_58.height = local_58.width;
      local_58.width = iVar11;
    }
    SplitFreeRectByHeuristic(this,this_00->Array + (int)local_7c,&local_58,splitMethod);
    TArray<Rect,_Rect>::Delete(this_00,local_7c);
    TArray<RectSize,_RectSize>::Delete(rects,local_80);
    if (merge) {
      MergeFreeList(this);
    }
    TArray<Rect,_Rect>::Push(local_38,&local_58);
    bVar2 = DisjointRectCollection::Add(local_40,&local_58);
    if (!bVar2) {
      __assert_fail("disjointRects.Add(newNode) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                    ,0x94,
                    "void GuillotineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                   );
    }
  } while( true );
}

Assistant:

void GuillotineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst, bool merge, 
	FreeRectChoiceHeuristic rectChoice, GuillotineSplitHeuristic splitMethod)
{
	dst.Clear();

	// Remember variables about the best packing choice we have made so far during the iteration process.
	int bestFreeRect = 0;
	int bestRect = 0;
	bool bestFlipped = false;

	// Pack rectangles one at a time until we have cleared the rects array of all rectangles.
	// rects will get destroyed in the process.
	while(rects.Size() > 0)
	{
		// Stores the penalty score of the best rectangle placement - bigger=worse, smaller=better.
		int bestScore = INT_MAX;

		for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		{
			for(unsigned j = 0; j < rects.Size(); ++j)
			{
				// If this rectangle is a perfect match, we pick it instantly.
				if (rects[j].width == freeRectangles[i].width && rects[j].height == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = false;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// If flipping this rectangle is a perfect match, pick that then.
				else if (rects[j].height == freeRectangles[i].width && rects[j].width == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = true;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// Try if we can fit the rectangle upright.
				else if (rects[j].width <= freeRectangles[i].width && rects[j].height <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].width, rects[j].height, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = false;
						bestScore = score;
					}
				}
				// If not, then perhaps flipping sideways will make it fit?
				else if (rects[j].height <= freeRectangles[i].width && rects[j].width <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].height, rects[j].width, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = true;
						bestScore = score;
					}
				}
			}
		}

		// If we didn't manage to find any rectangle to pack, abort.
		if (bestScore == INT_MAX)
			return;

		// Otherwise, we're good to go and do the actual packing.
		Rect newNode;
		newNode.x = freeRectangles[bestFreeRect].x;
		newNode.y = freeRectangles[bestFreeRect].y;
		newNode.width = rects[bestRect].width;
		newNode.height = rects[bestRect].height;

		if (bestFlipped)
			std::swap(newNode.width, newNode.height);

		// Remove the free space we lost in the bin.
		SplitFreeRectByHeuristic(freeRectangles[bestFreeRect], newNode, splitMethod);
		freeRectangles.Delete(bestFreeRect);

		// Remove the rectangle we just packed from the input list.
		rects.Delete(bestRect);

		// Perform a Rectangle Merge step if desired.
		if (merge)
			MergeFreeList();

		// Remember the new used rectangle.
		usedRectangles.Push(newNode);

		// Check that we're really producing correct packings here.
#ifdef _DEBUG
		assert(disjointRects.Add(newNode) == true);
#endif
	}
}